

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_c91b1::CreateJump(VmModule *module,SynBase *source,VmValue *label)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType type;
  VmValue *in_stack_ffffffffffffffc8;
  VmValue *label_local;
  SynBase *source_local;
  VmModule *module_local;
  
  bVar1 = VmType::operator==(&label->type,&VmType::Block);
  if (!bVar1) {
    __assert_fail("label->type == VmType::Block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2c9,
                  "VmValue *(anonymous namespace)::CreateJump(VmModule *, SynBase *, VmValue *)");
  }
  type.structType = (TypeBase *)0x1c;
  type._0_8_ = VmType::Void.structType;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_c91b1 *)module,(VmModule *)source,
                             (SynBase *)VmType::Void._0_8_,type,(VmInstructionType)label,
                             in_stack_ffffffffffffffc8);
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateJump(VmModule *module, SynBase *source, VmValue *label)
	{
		assert(label->type == VmType::Block);

		return CreateInstruction(module, source, VmType::Void, VM_INST_JUMP, label);
	}